

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O1

void __thiscall
Lodtalk::StackInterpreter::pushLongReceiverVariable(StackInterpreter *this,size_t receiverVarIndex)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  ulong uVar4;
  StackMemory *pSVar5;
  long lVar6;
  uint8_t *puVar7;
  uint uVar8;
  StackFrame previousFrame;
  StackFrame local_18;
  
  if (receiverVarIndex < 6) {
    pSVar5 = this->stack;
    plVar1 = (long *)(pSVar5->stackFrame).framePointer;
    puVar2 = (undefined8 *)plVar1[-4];
    if ((((((ulong)puVar2 & 1) == 0) && (uVar8 = (uint)puVar2 & 6, uVar8 != 2)) && (uVar8 != 4)) &&
       ((uint)((ulong)*puVar2 >> 0x2a) == 0x5c)) {
      if ((*(byte *)(puVar2 + 1) & 1) == 0) {
        lVar6 = 0;
        if ((plVar1[-4] & 7U) == 0) {
          lVar6 = plVar1[-4] + 8;
        }
        lVar6 = *(long *)(lVar6 + receiverVarIndex * 8);
LAB_0014a35f:
        puVar7 = (pSVar5->stackFrame).stackPointer;
        goto LAB_0014a3f9;
      }
      lVar6 = puVar2[1];
      if (receiverVarIndex == 1) {
        if ((long *)(lVar6 + -1) == plVar1) {
          lVar6 = this->pc * 2 + 1;
          goto LAB_0014a35f;
        }
      }
      else if (receiverVarIndex == 0) {
        if (*(long *)(lVar6 + -1) != 0) {
          local_18.framePointer = *(uint8_t **)(lVar6 + -1);
          local_18.stackPointer =
               (uint8_t *)(lVar6 + (ulong)(*(uint *)(lVar6 + -0x11) & 0xff) * 8 + 0x17);
          if (local_18.framePointer[-0xe] == '\0') {
            StackFrame::marryFrame(&local_18,this->context);
          }
          uVar3 = *(undefined8 *)(local_18.framePointer + -0x18);
          puVar7 = (this->stack->stackFrame).stackPointer;
          (this->stack->stackFrame).stackPointer = puVar7 + -8;
          *(undefined8 *)(puVar7 + -8) = uVar3;
          return;
        }
        puVar7 = (pSVar5->stackFrame).stackPointer;
        (pSVar5->stackFrame).stackPointer = puVar7 + -8;
        *(undefined8 **)(puVar7 + -8) = &NilObject;
        return;
      }
    }
  }
  pSVar5 = this->stack;
  puVar7 = (pSVar5->stackFrame).stackPointer;
  uVar4 = *(ulong *)((pSVar5->stackFrame).framePointer + -0x20);
  lVar6 = 0;
  if ((uVar4 & 7) == 0) {
    lVar6 = uVar4 + 8;
  }
  lVar6 = *(long *)(lVar6 + receiverVarIndex * 8);
LAB_0014a3f9:
  (pSVar5->stackFrame).stackPointer = puVar7 + -8;
  *(long *)(puVar7 + -8) = lVar6;
  return;
}

Assistant:

void pushLongReceiverVariable(size_t receiverVarIndex)
    {
        if(receiverVarIndex <= 5 && classIndexOf(currentReceiver()) == SCI_Context)
        {
            auto context = reinterpret_cast<Context*> (currentReceiver().pointer);
            if (!context->isMarriedOrWidowed())
                return pushReceiverVariable(receiverVarIndex);

            // TODO: Perform expensive check for widowed context.
            auto contextFP = context->sender.pointer - 1;
            StackFrame contextFrame(contextFP);
            auto prevFP = contextFrame.getPrevFramePointer();

            switch (receiverVarIndex)
            {
            case Context::SenderIndex:
            {
                if (!prevFP)
                {
                    pushOop(nilOop());
                }
                else
                {
                    auto previousFrame = contextFrame.getPreviousFrame();
                    previousFrame.ensureFrameIsMarried(this->context);
                    pushOop(previousFrame.getThisContext());
                }
                return;
            }
                break;
            case Context::PCIndex:
                if (contextFP == stack->getFramePointer())
                    return pushSmallIntegerObject(pc);
                break;
            case Context::StackPointerIndex:
                break;
            }
            auto value = getInstanceVariable(receiverVarIndex);
            //printf("get context var %d %p\n", (int)receiverVarIndex, value.pointer);
        }

        pushReceiverVariable(receiverVarIndex);
    }